

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O1

void __thiscall Options::COptionsParser::parseSyntaxValue(COptionsParser *this)

{
  byte bVar1;
  ulong uVar2;
  ulong in_RAX;
  long lVar3;
  char *badValueMessage;
  char *message;
  char this_option_is [2];
  char this_option_is_1 [2];
  undefined8 uStack_38;
  
  lVar3 = 0;
  uStack_38 = in_RAX;
  do {
    uVar2 = uStack_38;
    bVar1 = this->val[lVar3];
    if (bVar1 < 0x61) {
      if (bVar1 < 0x4c) {
        if (bVar1 == 0x42) {
          DAT_0018d518 = 2;
        }
        else {
          if (bVar1 != 0x46) {
            if (bVar1 == 0) {
              return;
            }
            goto switchD_0012909c_caseD_63;
          }
          _DAT_0018d50a = _DAT_0018d50a & 0xff00;
        }
      }
      else {
        if (bVar1 == 0x4c) goto switchD_0012909c_caseD_6c;
        if (bVar1 != 0x4d) goto switchD_0012909c_caseD_63;
        DAT_0018d516 = 1;
      }
      goto LAB_00129159;
    }
    switch(bVar1) {
    case 0x61:
      DAT_0018d520 = doubleComma;
      break;
    case 0x62:
      DAT_0018d518 = 1;
      break;
    case 99:
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_0012909c_caseD_63:
      uStack_38._6_2_ = SUB82(uVar2,6);
      uStack_38._0_6_ = (uint6)CONCAT14(bVar1,(undefined4)uStack_38);
      message = "Unrecognized syntax option";
      badValueMessage = (char *)((long)&uStack_38 + 4);
      goto LAB_0012914f;
    case 0x66:
      _DAT_0018d50a = 0x101;
      break;
    case 0x69:
      DAT_0018d514 = 1;
      break;
    case 0x6c:
switchD_0012909c_caseD_6c:
      uStack_38 = (ulong)CONCAT16(bVar1,(uint6)uStack_38);
      message = "Syntax option not implemented yet";
      badValueMessage = (char *)((long)&uStack_38 + 6);
LAB_0012914f:
      Error(message,badValueMessage,PASS03);
      break;
    default:
      if (bVar1 == 0x73) {
        DAT_0018d517 = 0;
      }
      else {
        if (bVar1 != 0x77) goto switchD_0012909c_caseD_63;
        DAT_0018d515 = 1;
      }
    }
LAB_00129159:
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x800) {
      return;
    }
  } while( true );
}

Assistant:

void parseSyntaxValue() {
			// Options::syx is expected to be already in default state before entering this
			for (const auto & syntaxOption : val) {
				switch (syntaxOption) {
				case 0:   return;
				// f F - instructions: fake warning, no fakes (default = fake enabled)
				case 'f': syx.FakeEnabled = syx.FakeWarning = true; break;
				case 'F': syx.FakeEnabled = false; break;
				// a - multi-argument delimiter ",," (default is ",")
				case 'a': syx.MultiArg = &doubleComma; break;
				// b - single parentheses enforce mem access (default = relaxed syntax)
				case 'b': syx.MemoryBrackets = 1; break;
				// B - memory access brackets [] required (default = relaxed syntax)
				case 'B': syx.MemoryBrackets = 2; break;
				// l L - warn/error about labels using keywords (default = no message)
				case 'l':
				case 'L':
				{
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Syntax option not implemented yet", this_option_is, PASS03);
					break;
				}
				// i - case insensitive instructions/directives (default = same case required)
				case 'i': syx.CaseInsensitiveInstructions = true; break;
				// w - warnings option: report warnings as errors
				case 'w': syx.WarningsAsErrors = true; break;
				// M - alias "m" and "M" for "(hl)" to cover 8080-like syntax: ADD A,M
				case 'M': syx.Is_M_Memory = true; break;
				// s - switch off sub-word substitution in DEFINEs (s like "Simple defines" or "Sub word")
				case 's': syx.IsSubwordSubstitution = false; break;
				// unrecognized option
				default:
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Unrecognized syntax option", this_option_is, PASS03);
					break;
				}
			}
		}